

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_load_lc_numeric.c
# Opt level: O1

int main(void)

{
  int iVar1;
  FILE *__stream;
  _PDCLIB_lc_lconv_numeric_t *p_Var2;
  
  __stream = fopen("test_numeric.dat","wb");
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x47,"fh != NULL");
  }
  iVar1 = fputs(",\n.\n\n",__stream);
  if (iVar1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x48,"fputs( \",\\n.\\n\\n\", fh ) != EOF");
  }
  fclose(__stream);
  p_Var2 = _PDCLIB_load_lc_numeric("./","test");
  if (p_Var2 == (_PDCLIB_lc_lconv_numeric_t *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x4a,"( lc = _PDCLIB_load_lc_numeric( \"./\", \"test\" ) )");
  }
  remove("test_numeric.dat");
  iVar1 = strcmp(p_Var2->decimal_point,",");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x4c,"strcmp( lc->decimal_point, \",\" ) == 0");
  }
  iVar1 = strcmp(p_Var2->thousands_sep,".");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x4d,"strcmp( lc->thousands_sep, \".\" ) == 0");
  }
  if (*p_Var2->grouping != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lc_numeric.c, line %d - %s\n"
           ,0x4e,"strcmp( lc->grouping, \"\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    FILE * fh = fopen( "test_numeric.dat", "wb" );
    struct _PDCLIB_lc_lconv_numeric_t * lc;
    TESTCASE( fh != NULL );
    TESTCASE( fputs( ",\n.\n\n", fh ) != EOF );
    fclose( fh );
    TESTCASE( ( lc = _PDCLIB_load_lc_numeric( "./", "test" ) ) );
    remove( "test_numeric.dat" );
    TESTCASE( strcmp( lc->decimal_point, "," ) == 0 );
    TESTCASE( strcmp( lc->thousands_sep, "." ) == 0 );
    TESTCASE( strcmp( lc->grouping, "" ) == 0 );
#endif

    return TEST_RESULTS;
}